

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XNA_Song.c
# Opt level: O0

void XNA_SongKill(void)

{
  uint32_t unaff_retaddr;
  uint32_t unaff_retaddr_00;
  FAudioSourceVoice *in_stack_00000008;
  FAudioVoice *in_stack_00000010;
  
  if (songVoice != (FAudioSourceVoice *)0x0) {
    FAudioSourceVoice_Stop(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    FAudioVoice_DestroyVoice(in_stack_00000010);
    songVoice = (FAudioSourceVoice *)0x0;
  }
  if (songCache != (uint8_t *)0x0) {
    SDL_free(songCache);
    songCache = (uint8_t *)0x0;
  }
  if (activeSong != (stb_vorbis *)0x0) {
    stb_vorbis_close((stb_vorbis *)0x1456e9);
    activeSong = (stb_vorbis *)0x0;
  }
  return;
}

Assistant:

static void XNA_SongKill()
{
	if (songVoice != NULL)
	{
		FAudioSourceVoice_Stop(songVoice, 0, 0);
		FAudioVoice_DestroyVoice(songVoice);
		songVoice = NULL;
	}
	if (songCache != NULL)
	{
		FAudio_free(songCache);
		songCache = NULL;
	}
	if (activeSong != NULL)
	{
		stb_vorbis_close(activeSong);
		activeSong = NULL;
	}
}